

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_flags_for_ground_items.hpp
# Opt level: O0

void __thiscall
PatchFlagsForGroundItems::add_mask_flags_for_already_taken_items
          (PatchFlagsForGroundItems *this,RandomizerWorld *world)

{
  undefined8 uVar1;
  bool bVar2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *this_00;
  reference ppIVar3;
  vector<Entity_*,_std::allocator<Entity_*>_> *this_01;
  reference ppEVar4;
  Entity *entity;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Entity_*,_std::allocator<Entity_*>_> *__range2;
  Flag flag_source_already_taken;
  ItemSourceOnGround *ground_source;
  ItemSourceOnGround *local_38;
  ItemSource *item_source;
  iterator __end1;
  iterator __begin1;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range1;
  RandomizerWorld *world_local;
  PatchFlagsForGroundItems *this_local;
  
  this_00 = RandomizerWorld::item_sources(world);
  __end1 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(this_00);
  item_source = (ItemSource *)std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(this_00)
  ;
  do {
    bVar2 = __gnu_cxx::
            operator==<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                      (&__end1,(__normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                *)&item_source);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    ppIVar3 = __gnu_cxx::
              __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
              ::operator*(&__end1);
    local_38 = (ItemSourceOnGround *)*ppIVar3;
    bVar2 = ItemSource::is_ground_item((ItemSource *)local_38);
    if (bVar2) {
      ground_source._7_1_ = ItemSource::item_id(&local_38->super_ItemSource);
      bVar2 = vectools::contains<unsigned_char>
                        (&this->_finite_ground_items,(uchar *)((long)&ground_source + 7));
      uVar1 = flag_source_already_taken._8_8_;
      flag_source_already_taken._8_8_ = local_38;
joined_r0x001d3ce2:
      local_38 = (ItemSourceOnGround *)flag_source_already_taken._8_8_;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        get_checked_flag_for_item_source
                  ((PatchFlagsForGroundItems *)&__range2,
                   (ItemSourceOnGround *)flag_source_already_taken._8_8_);
        this_01 = ItemSourceOnGround::entities
                            ((ItemSourceOnGround *)flag_source_already_taken._8_8_);
        __end2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::begin(this_01);
        entity = (Entity *)std::vector<Entity_*,_std::allocator<Entity_*>_>::end(this_01);
        while (bVar2 = __gnu_cxx::
                       operator==<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
                                 (&__end2,(__normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
                                           *)&entity), uVar1 = flag_source_already_taken._8_8_,
              ((bVar2 ^ 0xffU) & 1) != 0) {
          ppEVar4 = __gnu_cxx::
                    __normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>
                    ::operator*(&__end2);
          Entity::remove_when_flag_is_set(*ppEVar4,(Flag *)&__range2);
          __gnu_cxx::
          __normal_iterator<Entity_*const_*,_std::vector<Entity_*,_std::allocator<Entity_*>_>_>::
          operator++(&__end2);
        }
      }
    }
    else {
      bVar2 = ItemSource::is_shop_item(&local_38->super_ItemSource);
      uVar1 = flag_source_already_taken._8_8_;
      if (bVar2) {
        ground_source._6_1_ = ItemSource::item_id(&local_38->super_ItemSource);
        bVar2 = vectools::contains<unsigned_char>
                          (&this->_finite_shop_items,(uchar *)((long)&ground_source + 6));
        uVar1 = flag_source_already_taken._8_8_;
        flag_source_already_taken._8_8_ = local_38;
        goto joined_r0x001d3ce2;
      }
    }
    flag_source_already_taken._8_8_ = uVar1;
    __gnu_cxx::
    __normal_iterator<ItemSource_**,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void add_mask_flags_for_already_taken_items(RandomizerWorld& world)
    {
        for(ItemSource* item_source : world.item_sources())
        {
            if(item_source->is_ground_item())
            {
                if(!vectools::contains(_finite_ground_items, item_source->item_id()))
                    continue;
            }
            else if(item_source->is_shop_item())
            {
                if(!vectools::contains(_finite_shop_items, item_source->item_id()))
                    continue;
            }
            else continue; // Not a ground/shop item_source

            // If we reach this point, it means the item source contains an item that is considered as finite
            // and must be removed if already taken by the player
            ItemSourceOnGround* ground_source = reinterpret_cast<ItemSourceOnGround*>(item_source);
            Flag flag_source_already_taken = get_checked_flag_for_item_source(ground_source);
            for(Entity* entity : ground_source->entities())
                entity->remove_when_flag_is_set(flag_source_already_taken);
        }
    }